

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_mul_div_4_by_4_template.h
# Opt level: O2

bool __thiscall
test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<32U,_unsigned_char,_void>::test_binary_div
          (test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<32U,_unsigned_char,_void> *this)

{
  anon_class_32_4_006e9c57 parallel_function;
  uint __sd;
  random_generator_type *this_00;
  bool result_is_ok;
  atomic_flag test_lock;
  uniform_int_distribution<int> dis;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 *local_40;
  undefined1 *puStack_38;
  test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<32U,_unsigned_char,_void> *local_30;
  atomic_flag *paStack_28;
  undefined8 local_20;
  
  local_41 = 0;
  this_00 = test_uintwide_t_n_binary_ops_base::my_gen();
  __sd = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  std::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(this_00,__sd);
  paStack_28 = (atomic_flag *)&local_20;
  local_20 = 0x1f00000001;
  puStack_38 = &local_42;
  local_42 = 1;
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)puStack_38;
  parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)&local_41;
  parallel_function.distribution = (distribution_type *)this;
  parallel_function.rnd_lock = paStack_28;
  local_40 = &local_41;
  local_30 = this;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_mul_div_4_by_4_template<32u,unsigned_char,void>::test_binary_div()const::_lambda(unsigned_long)_1_>
            (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
               number_of_cases,parallel_function);
  return (bool)local_42;
}

Assistant:

WIDE_INTEGER_NODISCARD auto test_binary_div() const -> bool
    {
      std::atomic_flag test_lock = ATOMIC_FLAG_INIT;

      test_uintwide_t_n_binary_ops_base::my_gen().seed(util::util_pseudorandom_time_point_seed::value<typename random_generator_type::result_type>());
      std::uniform_int_distribution<> dis(1, static_cast<int>(digits2 - 1U));

      bool result_is_ok = true;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        size(),
        [&test_lock, &result_is_ok, this, &dis](std::size_t i)
        {
          while(test_lock.test_and_set()) { ; }
          const auto right_shift_amount = static_cast<std::size_t>(dis(my_gen()));
          test_lock.clear();

          const native_uint_cntrl_type c_cntrl = a_cntrl[i] / (std::max)(native_uint_cntrl_type(1U), native_uint_cntrl_type(b_cntrl[i] >> right_shift_amount));
          const local_uint_ab_type     c_local = a_local[i] / (std::max)(local_uint_ab_type(1U),                           (b_local[i] >> right_shift_amount));

          const std::string str_boost = hexlexical_cast(c_cntrl);
          const std::string str_local = hexlexical_cast(c_local);

          while(test_lock.test_and_set()) { ; }
          result_is_ok = ((str_boost == str_local) && result_is_ok);
          test_lock.clear();
        }
      );

      return result_is_ok;
    }